

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

string * __thiscall
lest::make_string<S,void()>(string *__return_storage_ptr__,lest *this,offset_in_S_to_subr ptr)

{
  uint *puVar1;
  long lVar2;
  char cVar3;
  ostringstream os;
  undefined1 auStack_1b8 [8];
  size_type *local_1b0;
  size_type local_1a8;
  size_type local_1a0;
  undefined8 uStack_198;
  long local_190 [2];
  undefined8 uStack_180;
  uint auStack_178 [22];
  ios_base local_120 [112];
  char acStack_b0 [152];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffff4f | 0x10;
  *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | 8;
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 | 0x200;
  *(undefined8 *)((long)&uStack_180 + *(long *)(local_190[0] + -0x18)) = 0x22;
  lVar2 = *(long *)(local_190[0] + -0x18);
  if (acStack_b0[lVar2 + 1] == '\0') {
    cVar3 = std::ios::widen((char)auStack_1b8 + (char)lVar2 + '(');
    acStack_b0[lVar2] = cVar3;
    acStack_b0[lVar2 + 1] = '\x01';
  }
  acStack_b0[lVar2] = '0';
  std::ostream::_M_insert<bool>(SUB81(local_190,0));
  std::__cxx11::ostringstream::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_1b0 == &local_1a0) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_1a0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_198;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1b0;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_1a0;
  }
  __return_storage_ptr__->_M_string_length = local_1a8;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

inline std::string make_string( R C::* ptr )
{
    std::ostringstream os;
    os << std::internal << std::hex << std::showbase << std::setw( 2 + 2 * sizeof(R C::* ) ) << std::setfill('0') << ptr;
    return os.str();
}